

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::PrecisionCase::PrecisionCase
          (PrecisionCase *this,CaseContext *context,string *name,string *extension)

{
  TestContext *testCtx;
  pointer pcVar1;
  long lVar2;
  TestContext **ppTVar3;
  TestContext **ppTVar4;
  byte bVar5;
  allocator<char> local_6a;
  allocator<char> local_69;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  bVar5 = 0;
  testCtx = context->testContext;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(name->_M_dataplus)._M_p,&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,(name->_M_dataplus)._M_p,&local_6a);
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(char *)local_48[0],(char *)local_68[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d1aed0;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PrecisionCase_00d34e90;
  (this->m_ctx).name._M_dataplus._M_p = (pointer)&(this->m_ctx).name.field_2;
  pcVar1 = (context->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_ctx,pcVar1,pcVar1 + (context->name)._M_string_length);
  ppTVar3 = &context->testContext;
  ppTVar4 = &(this->m_ctx).testContext;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    *ppTVar4 = *ppTVar3;
    ppTVar3 = ppTVar3 + (ulong)bVar5 * -2 + 1;
    ppTVar4 = ppTVar4 + (ulong)bVar5 * -2 + 1;
  }
  (this->m_extension)._M_dataplus._M_p = (pointer)&(this->m_extension).field_2;
  pcVar1 = (extension->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_extension,pcVar1,pcVar1 + extension->_M_string_length);
  (this->m_spec).outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spec).outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spec).inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spec).outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spec).inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spec).inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spec).globalDeclarations._M_dataplus._M_p =
       (pointer)&(this->m_spec).globalDeclarations.field_2;
  (this->m_spec).globalDeclarations._M_string_length = 0;
  (this->m_spec).globalDeclarations.field_2._M_local_buf[0] = '\0';
  (this->m_spec).source._M_dataplus._M_p = (pointer)&(this->m_spec).source.field_2;
  (this->m_spec).source._M_string_length = 0;
  (this->m_spec).source.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PrecisionCase	(const CaseContext& context, const string& name, const string& extension = "")
							: TestCase		(context.testContext, name.c_str(), name.c_str())
							, m_ctx			(context)
							, m_extension	(extension)
							{
							}